

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

void Rtm_ObjTransferToBigger(Rtm_Man_t *p,Rtm_Edg_t *pEdge)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar2 = *(uint *)pEdge;
  if ((~uVar2 & 0xf) == 0) {
    uVar6 = (uVar2 & 0xfff) + 1;
    uVar4 = uVar6 >> 4;
    iVar5 = p->nExtraCur;
    if ((int)(uVar4 + iVar5) < p->nExtraAlloc) {
      puVar1 = p->pExtra;
    }
    else {
      uVar2 = p->nExtraAlloc * 2;
      uVar3 = 0x400;
      if (0x400 < (int)uVar2) {
        uVar3 = (ulong)uVar2;
      }
      if (p->pExtra == (uint *)0x0) {
        puVar1 = (uint *)malloc(uVar3 * 4);
      }
      else {
        puVar1 = (uint *)realloc(p->pExtra,uVar3 * 4);
        iVar5 = p->nExtraCur;
      }
      p->pExtra = puVar1;
      p->nExtraAlloc = (int)uVar3;
      uVar2 = *(uint *)pEdge;
    }
    memcpy(puVar1 + iVar5,puVar1 + (uVar2 >> 0xc),(ulong)(uVar6 >> 2));
    p->pExtra[(ulong)uVar4 + (long)p->nExtraCur] = 0;
    *(uint *)pEdge = *(uint *)pEdge & 0xfff | p->nExtraCur << 0xc;
    p->nExtraCur = p->nExtraCur + uVar4 + 1;
    return;
  }
  __assert_fail("(pEdge->nLats & 15) == 15",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                ,0xc9,"void Rtm_ObjTransferToBigger(Rtm_Man_t *, Rtm_Edg_t *)");
}

Assistant:

void Rtm_ObjTransferToBigger( Rtm_Man_t * p, Rtm_Edg_t * pEdge ) 
{
    int nWords;
    assert( (pEdge->nLats & 15) == 15 );
    nWords = (pEdge->nLats + 1) >> 4;
    if ( p->nExtraCur + nWords + 1 > p->nExtraAlloc )
    {
        int nExtraAllocNew = Abc_MaxInt( 2 * p->nExtraAlloc, 1024 );
        p->pExtra = ABC_REALLOC( unsigned, p->pExtra, nExtraAllocNew );
        p->nExtraAlloc = nExtraAllocNew;
    }
    memcpy( p->pExtra + p->nExtraCur, p->pExtra + pEdge->LData, sizeof(unsigned) * nWords );
    p->pExtra[p->nExtraCur + nWords] = 0;
    pEdge->LData = p->nExtraCur;
    p->nExtraCur += nWords + 1;
}